

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

char __thiscall lexer::Lexer::peekChar(Lexer *this)

{
  int iVar1;
  ulong uVar2;
  
  iVar1 = this->readPosition;
  uVar2 = (this->input)._M_string_length;
  if ((int)uVar2 <= iVar1) {
    return '\0';
  }
  if ((ulong)(long)iVar1 < uVar2) {
    return (this->input)._M_dataplus._M_p[iVar1];
  }
  std::__throw_out_of_range_fmt
            ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

char Lexer::peekChar()
{
    if(readPosition >= (int) input.size()){
        return 0;
    }else{
        return input.at(readPosition);
    }
}